

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O1

int LowMC_test_vector_255_255_4_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [32];
  uint8_t plaintext [32];
  uint8_t key [32];
  uint8_t local_68 [104];
  
  local_68[0x40] = '|';
  local_68[0x41] = ' ';
  local_68[0x42] = 0xbe;
  local_68[0x43] = 'S';
  local_68[0x44] = 0xb6;
  local_68[0x45] = 0xd6;
  local_68[0x46] = '\0';
  local_68[0x47] = 0x81;
  local_68[0x48] = 'I';
  local_68[0x49] = 0xe1;
  local_68[0x4a] = 0x9a;
  local_68[0x4b] = '4';
  local_68[0x4c] = 0xb9;
  local_68[0x4d] = '}';
  local_68[0x4e] = 0x96;
  local_68[0x4f] = 0x84;
  local_68[0x50] = 0xa0;
  local_68[0x51] = 0x91;
  local_68[0x52] = 'L';
  local_68[0x53] = 0xaf;
  local_68[0x54] = 0x9f;
  local_68[0x55] = '\x7f';
  local_68[0x56] = '8';
  local_68[0x57] = 0xb2;
  local_68[0x58] = 'I';
  local_68[0x59] = 0x98;
  local_68[0x5a] = '\x11';
  local_68[0x5b] = '6';
  local_68[0x5c] = 0x9c;
  local_68[0x5d] = '?';
  local_68[0x5e] = 'S';
  local_68[0x5f] = 0xda;
  local_68[0x20] = 0x88;
  local_68[0x21] = 'c';
  local_68[0x22] = 0xf1;
  local_68[0x23] = ')';
  local_68[0x24] = 0xc0;
  local_68[0x25] = '8';
  local_68[0x26] = 'z';
  local_68[0x27] = 0xe5;
  local_68[0x28] = 0xa4;
  local_68[0x29] = '\x02';
  local_68[0x2a] = 0xa4;
  local_68[0x2b] = 0x9b;
  local_68[0x2c] = 0xd6;
  local_68[0x2d] = 'I';
  local_68[0x2e] = '\'';
  local_68[0x2f] = 0xc4;
  local_68[0x30] = 0xc6;
  local_68[0x31] = 'Y';
  local_68[0x32] = 'd';
  local_68[0x33] = 0xfb;
  local_68[0x34] = 0x85;
  local_68[0x35] = '1';
  local_68[0x36] = 0xb0;
  local_68[0x37] = 0xd7;
  local_68[0x38] = 'a';
  local_68[0x39] = 0xb1;
  local_68[0x3a] = 'a';
  local_68[0x3b] = 0xb4;
  local_68[0x3c] = 0xc9;
  local_68[0x3d] = '{';
  local_68[0x3e] = 'u';
  local_68[0x3f] = '^';
  local_68[0] = '\x03';
  local_68[1] = 0xb6;
  local_68[2] = 0xe4;
  local_68[3] = 0xb6;
  local_68[4] = '<';
  local_68[5] = 200;
  local_68[6] = 0xb0;
  local_68[7] = 0x82;
  local_68[8] = 'h';
  local_68[9] = 0xb6;
  local_68[10] = 'x';
  local_68[0xb] = '\x1d';
  local_68[0xc] = 'Z';
  local_68[0xd] = 'b';
  local_68[0xe] = 0x9d;
  local_68[0xf] = 'n';
  local_68[0x10] = '\x03';
  local_68[0x11] = '\x02';
  local_68[0x12] = '\f';
  local_68[0x13] = '\x1c';
  local_68[0x14] = '\x04';
  local_68[0x15] = 0x8d;
  local_68[0x16] = 'F';
  local_68[0x17] = 0x84;
  local_68[0x18] = '\x16';
  local_68[0x19] = '\x1b';
  local_68[0x1a] = 0x90;
  local_68[0x1b] = 0xad;
  local_68[0x1c] = 's';
  local_68[0x1d] = '3';
  local_68[0x1e] = 0x91;
  local_68[0x1f] = '&';
  iVar1 = lowmc_enc(&parameters_255_255_4,local_68 + 0x40,local_68 + 0x20,local_68);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_255_255_4_2(void) {
  const uint8_t key[32] = {
      0x7c, 0x20, 0xbe, 0x53, 0xb6, 0xd6, 0x0,  0x81, 0x49, 0xe1, 0x9a,
      0x34, 0xb9, 0x7d, 0x96, 0x84, 0xa0, 0x91, 0x4c, 0xaf, 0x9f, 0x7f,
      0x38, 0xb2, 0x49, 0x98, 0x11, 0x36, 0x9c, 0x3f, 0x53, 0xda,
  };
  const uint8_t plaintext[32] = {
      0x88, 0x63, 0xf1, 0x29, 0xc0, 0x38, 0x7a, 0xe5, 0xa4, 0x2,  0xa4,
      0x9b, 0xd6, 0x49, 0x27, 0xc4, 0xc6, 0x59, 0x64, 0xfb, 0x85, 0x31,
      0xb0, 0xd7, 0x61, 0xb1, 0x61, 0xb4, 0xc9, 0x7b, 0x75, 0x5e,
  };
  const uint8_t ciphertext_expected[32] = {
      0x3, 0xb6, 0xe4, 0xb6, 0x3c, 0xc8, 0xb0, 0x82, 0x68, 0xb6, 0x78, 0x1d, 0x5a, 0x62, 0x9d, 0x6e,
      0x3, 0x2,  0xc,  0x1c, 0x4,  0x8d, 0x46, 0x84, 0x16, 0x1b, 0x90, 0xad, 0x73, 0x33, 0x91, 0x26,
  };

  return lowmc_enc(&parameters_255_255_4, key, plaintext, ciphertext_expected);
}